

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2text.cpp
# Opt level: O0

void setTempo(MidiFile *midifile,int index,double *tempo)

{
  byte bVar1;
  byte bVar2;
  MidiEventList *this;
  MidiEvent *this_00;
  byte *pbVar3;
  ostream *poVar4;
  double dVar5;
  double newtempo;
  int microseconds;
  MidiEvent *mididata;
  double *tempo_local;
  int index_local;
  MidiFile *midifile_local;
  
  setTempo::count = setTempo::count + 1;
  this = smf::MidiFile::operator[](midifile,0);
  this_00 = smf::MidiEventList::operator[](this,index);
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,3);
  bVar1 = *pbVar3;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,4);
  bVar2 = *pbVar3;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,5);
  dVar5 = (60.0 / (double)((uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)*pbVar3)) * 1000000.0;
  if (setTempo::count < 2) {
    *tempo = dVar5;
  }
  else if ((*tempo != dVar5) || (NAN(*tempo) || NAN(dVar5))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"; WARNING: change of tempo from ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*tempo);
    poVar4 = std::operator<<(poVar4," to ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar5);
    poVar4 = std::operator<<(poVar4," ignored");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void setTempo(MidiFile& midifile, int index, double& tempo) {
   static int count = 0;
   count++;

   MidiEvent& mididata = midifile[0][index];

   int microseconds = 0;
   microseconds = microseconds | (mididata[3] << 16);
   microseconds = microseconds | (mididata[4] << 8);
   microseconds = microseconds | (mididata[5] << 0);

   double newtempo = 60.0 / microseconds * 1000000.0;
   if (count <= 1) {
      tempo = newtempo;
   } else if (tempo != newtempo) {
      cout << "; WARNING: change of tempo from " << tempo
           << " to " << newtempo << " ignored" << endl;
   }
}